

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels_roi
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,int roix,
                int roiy,int roiw,int roih,Allocator *allocator)

{
  undefined8 in_stack_ffffffffffffffd8;
  
  if (((((roiy | roix) < 0) || (roiw < 1)) || (roih < 1)) ||
     ((w < roiw + roix || (h < roih + roiy)))) {
    fprintf(_stderr,"roi %d %d %d %d out of image %d %d",(ulong)(uint)roix,(ulong)(uint)roiy,
            (ulong)(uint)roiw,(ulong)(uint)roih,
            CONCAT44((int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),w),h);
    fputc(10,_stderr);
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  else {
    if ((type & 0xffffU) - 1 < 2) {
      roix = roix * 3;
    }
    else if ((type & 0xffffU) != 3) {
      if ((type & 0xfffeU) != 4) {
        from_pixels_roi();
        return __return_storage_ptr__;
      }
      roix = roix << 2;
    }
    from_pixels(__return_storage_ptr__,pixels + (long)(roiy * stride) + (ulong)(uint)roix,type,roiw,
                roih,stride,allocator);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels_roi(const unsigned char* pixels, int type, int w, int h, int stride, int roix, int roiy, int roiw, int roih, Allocator* allocator)
{
    if (roix < 0 || roiy < 0 || roiw <= 0 || roih <= 0 || roix + roiw > w || roiy + roih > h)
    {
        NCNN_LOGE("roi %d %d %d %d out of image %d %d", roix, roiy, roiw, roih, w, h);
        return Mat();
    }

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return from_pixels(pixels + roiy * stride + roix * 3, type, roiw, roih, stride, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return from_pixels(pixels + roiy * stride + roix * 1, type, roiw, roih, stride, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return from_pixels(pixels + roiy * stride + roix * 4, type, roiw, roih, stride, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}